

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureLODCase::test
          (TextureLODCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TesterType tester;
  QueryType QVar1;
  TestLog *pTVar2;
  bool bVar3;
  bool bVar4;
  deUint32 dVar5;
  GLenum GVar6;
  long *plVar7;
  size_type *psVar8;
  int iVar9;
  int param;
  ulong uVar10;
  undefined8 uVar11;
  uint expected;
  float fVar12;
  ScopedLogSection section;
  GLint ref;
  ScopedLogSection section_1;
  Random rnd;
  ScopedLogSection local_110;
  long local_108;
  TestLog local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  uint local_70;
  float local_6c;
  code *local_68;
  GLenum local_60;
  int local_54;
  float local_50;
  float local_4c;
  ScopedLogSection local_48;
  deRandom local_40;
  
  tester = (this->super_TextureTest).m_tester;
  bVar3 = isPureIntTester(tester);
  bVar4 = true;
  if (!bVar3) {
    bVar4 = isPureUintTester(tester);
  }
  GVar6 = (this->super_TextureTest).m_pname;
  QVar1 = (this->super_TextureTest).m_type;
  expected = 0xfffffc18;
  if (GVar6 != 0x813a) {
    expected = -(uint)(GVar6 != 0x813b) | 1000;
  }
  if ((bVar4 == false) &&
     (GVar6 == 0x813b ||
      QVar1 != QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER &&
      QVar1 != QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER)) {
    pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Initial","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_110,pTVar2,&local_d0,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               expected,(this->super_TextureTest).m_type);
    tcu::TestLog::endSection(local_110.m_log);
  }
  pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Set","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Set","");
  tcu::ScopedLogSection::ScopedLogSection(&local_48,pTVar2,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  deRandom_init(&local_40,0xabcdef);
  if (bVar4 == false) {
    QVar1 = (this->super_TextureTest).m_type;
    local_54 = -1000;
    if (QVar1 == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER) {
      local_54 = 0;
    }
    if (QVar1 == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER) {
      local_54 = 0;
    }
    local_4c = (float)local_54;
    local_50 = 1000.0 - local_4c;
    iVar9 = 0x14;
    do {
      fVar12 = deRandom_getFloat(&local_40);
      local_6c = fVar12 * local_50 + local_4c;
      glu::CallLogWrapper::glTexParameterf
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,local_6c);
      GVar6 = glu::CallLogWrapper::glGetError(gl);
      if (GVar6 != 0) {
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
        local_68 = glu::getErrorName;
        local_60 = GVar6;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_68);
        uVar10 = 0xf;
        if (local_90 != local_80) {
          uVar10 = local_80[0];
        }
        if (uVar10 < local_b0._M_string_length + local_88) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            uVar11 = local_b0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_b0._M_string_length + local_88) goto LAB_01871b8e;
          plVar7 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
        }
        else {
LAB_01871b8e:
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
        }
        local_110.m_log = &local_100;
        pTVar2 = (TestLog *)(plVar7 + 2);
        if ((TestLog *)*plVar7 == pTVar2) {
          local_100.m_log = pTVar2->m_log;
          lStack_f8 = plVar7[3];
        }
        else {
          local_100.m_log = pTVar2->m_log;
          local_110.m_log = (TestLog *)*plVar7;
        }
        local_108 = plVar7[1];
        *plVar7 = (long)pTVar2;
        plVar7[1] = 0;
        *(undefined1 *)&pTVar2->m_log = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_f0.field_2._M_allocated_capacity = *psVar8;
          local_f0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar8;
          local_f0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_f0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_d0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (local_110.m_log != &local_100) {
          operator_delete(local_110.m_log,(ulong)((long)&(local_100.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
      }
      StateQueryUtil::verifyStateTextureParamFloat
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_6c,(this->super_TextureTest).m_type);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    local_6c = (float)(0x3e9 - local_54);
    iVar9 = 0x14;
    do {
      dVar5 = deRandom_getUint32(&local_40);
      param = dVar5 % (uint)local_6c + local_54;
      glu::CallLogWrapper::glTexParameteri
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,param);
      GVar6 = glu::CallLogWrapper::glGetError(gl);
      if (GVar6 != 0) {
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
        local_68 = glu::getErrorName;
        local_60 = GVar6;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_68);
        uVar10 = 0xf;
        if (local_90 != local_80) {
          uVar10 = local_80[0];
        }
        if (uVar10 < local_b0._M_string_length + local_88) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            uVar11 = local_b0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_b0._M_string_length + local_88) goto LAB_01871e73;
          plVar7 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
        }
        else {
LAB_01871e73:
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
        }
        local_110.m_log = &local_100;
        pTVar2 = (TestLog *)(plVar7 + 2);
        if ((TestLog *)*plVar7 == pTVar2) {
          local_100.m_log = pTVar2->m_log;
          lStack_f8 = plVar7[3];
        }
        else {
          local_100.m_log = pTVar2->m_log;
          local_110.m_log = (TestLog *)*plVar7;
        }
        local_108 = plVar7[1];
        *plVar7 = (long)pTVar2;
        plVar7[1] = 0;
        *(undefined1 *)&pTVar2->m_log = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_f0.field_2._M_allocated_capacity = *psVar8;
          local_f0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar8;
          local_f0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_f0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_d0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (local_110.m_log != &local_100) {
          operator_delete(local_110.m_log,(ulong)((long)&(local_100.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
      }
      StateQueryUtil::verifyStateTextureParamFloat
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 (float)param,(this->super_TextureTest).m_type);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  else {
    bVar3 = isPureIntTester((this->super_TextureTest).m_tester);
    iVar9 = 0x14;
    if (bVar3) {
      do {
        dVar5 = deRandom_getUint32(&local_40);
        local_70 = dVar5 % 0x7d1 - 1000;
        glu::CallLogWrapper::glTexParameterIiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   (GLint *)&local_70);
        GVar6 = glu::CallLogWrapper::glGetError(gl);
        if (GVar6 != 0) {
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
          local_68 = glu::getErrorName;
          local_60 = GVar6;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_68);
          uVar10 = 0xf;
          if (local_90 != local_80) {
            uVar10 = local_80[0];
          }
          if (uVar10 < local_b0._M_string_length + local_88) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              uVar11 = local_b0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_b0._M_string_length + local_88) goto LAB_01871586;
            plVar7 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
          }
          else {
LAB_01871586:
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
          }
          local_110.m_log = &local_100;
          pTVar2 = (TestLog *)(plVar7 + 2);
          if ((TestLog *)*plVar7 == pTVar2) {
            local_100.m_log = pTVar2->m_log;
            lStack_f8 = plVar7[3];
          }
          else {
            local_100.m_log = pTVar2->m_log;
            local_110.m_log = (TestLog *)*plVar7;
          }
          local_108 = plVar7[1];
          *plVar7 = (long)pTVar2;
          plVar7[1] = 0;
          *(undefined1 *)&pTVar2->m_log = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          psVar8 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_f0.field_2._M_allocated_capacity = *psVar8;
            local_f0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar8;
            local_f0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_f0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar8 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_d0.field_2._M_allocated_capacity = *psVar8;
            local_d0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar8;
            local_d0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_d0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          tcu::ResultCollector::fail(result,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if (local_110.m_log != &local_100) {
            operator_delete(local_110.m_log,(ulong)((long)&(local_100.m_log)->flags + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (local_90 != local_80) {
            operator_delete(local_90,local_80[0] + 1);
          }
        }
        StateQueryUtil::verifyStateTextureParamFloat
                  (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   (float)(int)local_70,(this->super_TextureTest).m_type);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    else {
      do {
        dVar5 = deRandom_getUint32(&local_40);
        local_70 = dVar5 % 0x3e9;
        glu::CallLogWrapper::glTexParameterIuiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_70
                  );
        GVar6 = glu::CallLogWrapper::glGetError(gl);
        if (GVar6 != 0) {
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
          local_68 = glu::getErrorName;
          local_60 = GVar6;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_68);
          uVar10 = 0xf;
          if (local_90 != local_80) {
            uVar10 = local_80[0];
          }
          if (uVar10 < local_b0._M_string_length + local_88) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              uVar11 = local_b0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_b0._M_string_length + local_88) goto LAB_01871861;
            plVar7 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
          }
          else {
LAB_01871861:
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
          }
          local_110.m_log = &local_100;
          pTVar2 = (TestLog *)(plVar7 + 2);
          if ((TestLog *)*plVar7 == pTVar2) {
            local_100.m_log = pTVar2->m_log;
            lStack_f8 = plVar7[3];
          }
          else {
            local_100.m_log = pTVar2->m_log;
            local_110.m_log = (TestLog *)*plVar7;
          }
          local_108 = plVar7[1];
          *plVar7 = (long)pTVar2;
          plVar7[1] = 0;
          *(undefined1 *)&pTVar2->m_log = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          psVar8 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_f0.field_2._M_allocated_capacity = *psVar8;
            local_f0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar8;
            local_f0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_f0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar8 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_d0.field_2._M_allocated_capacity = *psVar8;
            local_d0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar8;
            local_d0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_d0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          tcu::ResultCollector::fail(result,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if (local_110.m_log != &local_100) {
            operator_delete(local_110.m_log,(ulong)((long)&(local_100.m_log)->flags + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (local_90 != local_80) {
            operator_delete(local_90,local_80[0] + 1);
          }
        }
        StateQueryUtil::verifyStateTextureParamFloat
                  (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   (float)local_70,(this->super_TextureTest).m_type);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
  }
  tcu::TestLog::endSection(local_48.m_log);
  return;
}

Assistant:

void TextureLODCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool	isPureCase		= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const int	initialValue	= (m_pname == GL_TEXTURE_MIN_LOD) ? (-1000)
								: (m_pname == GL_TEXTURE_MAX_LOD) ? (1000)
								: (-1);

	if ((querySupportsSigned(m_type) || initialValue >= 0) && !isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, initialValue, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const int					numIterations	= 20;
		de::Random					rnd				(0xabcdef);

		if (isPureCase)
		{
			if (isPureIntTester(m_tester))
			{
				for (int ndx = 0; ndx < numIterations; ++ndx)
				{
					const GLint ref = rnd.getInt(-1000, 1000);

					gl.glTexParameterIiv(m_target, m_pname, &ref);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");

					verifyStateTextureParamFloat(result, gl, m_target, m_pname, (float)ref, m_type);
				}
			}
			else
			{
				DE_ASSERT(isPureUintTester(m_tester));

				for (int ndx = 0; ndx < numIterations; ++ndx)
				{
					const GLuint ref = (glw::GLuint)rnd.getInt(0, 1000);

					gl.glTexParameterIuiv(m_target, m_pname, &ref);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");

					verifyStateTextureParamFloat(result, gl, m_target, m_pname, (float)ref, m_type);
				}
			}
		}
		else
		{
			const int minLimit = (querySupportsSigned(m_type)) ? (-1000) : (0);

			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLfloat ref = rnd.getFloat((float)minLimit, 1000.f);

				gl.glTexParameterf(m_target, m_pname, ref);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

				verifyStateTextureParamFloat(result, gl, m_target, m_pname, ref, m_type);
			}

			// check unit conversions with int

			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLint ref = rnd.getInt(minLimit, 1000);

				gl.glTexParameteri(m_target, m_pname, ref);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamFloat(result, gl, m_target, m_pname, (float)ref, m_type);
			}
		}
	}
}